

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
find<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long_const&>
          (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table,
          unsigned_long *params)

{
  int iVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  uint uVar4;
  Entry *pEVar5;
  ulong uVar6;
  unsigned_long *in_R8;
  Maybe<unsigned_long> MVar7;
  
  pEVar5 = table.ptr;
  aVar3.value = table.size_;
  if (pEVar5[1].value != (RawSchema *)0x0) {
    uVar2 = hashCode<unsigned_long_const&>(in_R8);
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pEVar5[1].value;
    uVar4 = (int)aVar3.value - 1U & uVar2;
    while( true ) {
      uVar6 = (ulong)uVar4;
      iVar1 = *(int *)(pEVar5[1].key + 4 + uVar6 * 8);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(pEVar5[1].key + uVar6 * 8) == uVar2)) &&
         (*(unsigned_long *)(table.size_ + (ulong)(iVar1 - 2) * 0x10) == *in_R8)) {
        *this = (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_00141ae6;
      }
      uVar4 = (uint)(uVar6 + 1);
      if (uVar6 + 1 == aVar3.value) {
        uVar4 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0;
LAB_00141ae6:
  MVar7.ptr.field_1.value = aVar3.value;
  MVar7.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }